

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# playmidi.cpp
# Opt level: O2

void __thiscall Timidity::Renderer::note_on(Renderer *this,int chan,int note,int vel)

{
  Voice *pVVar1;
  int iVar2;
  long lVar3;
  int *piVar4;
  int i;
  long lVar5;
  bool bVar6;
  
  if (vel == 0) {
    note_off(this,chan,note,0);
    return;
  }
  i = this->voices;
  lVar5 = (long)i;
  piVar4 = &this->channel[(uint)chan].mono;
  lVar3 = lVar5 * 0x170 + -0x16f;
  do {
    i = i + -1;
    bVar6 = lVar5 == 0;
    lVar5 = lVar5 + -1;
    if (bVar6) {
      start_note(this,chan,note,vel);
      return;
    }
    pVVar1 = this->voice;
    if ((uint)(&pVVar1->status)[lVar3] == chan) {
      if ((uint)(&pVVar1->channel)[lVar3] == note) {
        iVar2 = *piVar4;
        if (*(char *)(*(long *)(&pVVar1->field_0x7 + lVar3) + 0x50) == '\x01') goto LAB_00370ce3;
        if (iVar2 == 0) {
          finish_note(this,i);
          goto LAB_00370cf5;
        }
      }
      else {
        iVar2 = *piVar4;
LAB_00370ce3:
        if (iVar2 == 0) goto LAB_00370cf5;
      }
      kill_note(this,i);
    }
LAB_00370cf5:
    lVar3 = lVar3 + -0x170;
  } while( true );
}

Assistant:

void Renderer::note_on(int chan, int note, int vel)
{
	if (vel == 0)
	{
		note_off(chan, note, 0);
		return;
	}

	int i = voices;

	/* Only one instance of a note can be playing on a single channel. */
	while (i--)
	{
		if (voice[i].channel == chan && ((voice[i].note == note && !voice[i].sample->self_nonexclusive) || channel[chan].mono))
		{
			if (channel[chan].mono)
			{
				kill_note(i);
			}
			else
			{
				finish_note(i);
			}
		}
	}

	start_note(chan, note, vel);
}